

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O2

ATNNode<unsigned_char> * __thiscall
Centaurus::Grammar<unsigned_char>::resolve(Grammar<unsigned_char> *this,ATNPath *path)

{
  mapped_type *pmVar1;
  
  pmVar1 = std::__detail::
           _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->m_networks,
                &(path->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ).
                 super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first);
  return (pmVar1->m_nodes).
         super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
         ._M_impl.super__Vector_impl_data._M_start +
         (path->
         super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
         ).
         super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].second;
}

Assistant:

const ATNNode<TCHAR>& resolve(const ATNPath& path) const
    {
        return m_networks.at(path.leaf_id()).get_node(path.leaf_index());
    }